

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QFlags<QtMocConstants::EnumFlags> __thiscall
QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::value
          (QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *this,QByteArray *key,
          QFlags<QtMocConstants::EnumFlags> *defaultValue)

{
  bool bVar1;
  pointer ppVar2;
  Int *in_RDX;
  long in_FS_OFFSET;
  const_iterator i;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  _Self local_20;
  _Self local_18;
  QFlagsStorageHelper<QtMocConstants::EnumFlags,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>_>
                      *)0x116b44);
  if (bVar1) {
    local_18._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>_>
                  *)0x116b6b);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
         ::find((map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                (key_type *)0x116b7c);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>_>
                  *)0x116b8b);
    local_20._M_node =
         (_Base_ptr)
         std::
         map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
         ::cend((map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    bVar1 = std::operator!=(&local_18,&local_20);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>
                             *)0x116bbb);
      local_c.super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
           (QFlagsStorage<QtMocConstants::EnumFlags>)
           (ppVar2->second).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
           super_QFlagsStorage<QtMocConstants::EnumFlags>.i;
    }
    else {
      local_c.super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
           (QFlagsStorage<QtMocConstants::EnumFlags>)*in_RDX;
    }
  }
  else {
    local_c.super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
         (QFlagsStorage<QtMocConstants::EnumFlags>)*in_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>)
           (QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>)
           local_c.super_QFlagsStorage<QtMocConstants::EnumFlags>.i;
  }
  __stack_chk_fail();
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }